

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,byte param_5)

{
  undefined8 uVar1;
  unspecified_bool_type p_Var2;
  xml_node_struct *pxVar3;
  bool axis_has_attributes;
  axis_t axis;
  xpath_node *in_stack_ffffffffffffff98;
  xml_node local_48;
  xml_node local_40;
  undefined1 local_31;
  undefined4 local_30;
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  void *local_10;
  
  local_29 = param_5 & 1;
  local_30 = 0xb;
  local_31 = 0;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  local_40 = xpath_node::node(in_stack_ffffffffffffff98);
  p_Var2 = xml_node::operator_cast_to_function_pointer(&local_40);
  uVar1 = local_18;
  if (p_Var2 != (unspecified_bool_type)0x0) {
    local_48 = xpath_node::node(in_stack_ffffffffffffff98);
    pxVar3 = xml_node::internal_object(&local_48);
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
              ((xpath_ast_node *)param_1,uVar1,pxVar3,local_28,local_29 & 1);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}